

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
       *this)

{
  pointer piVar1;
  iterator __x;
  bool bVar2;
  mapped_type *this_00;
  iterator __begin0;
  iterator __end0;
  key_type_conflict local_e1;
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  *local_e0;
  iterator local_d8;
  iterator local_a0;
  iterator local_68;
  
  piVar1 = (this->source).source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->source).source.current._M_current =
       (this->source).source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->source).source.end._M_current = piVar1;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::begin
            (&local_d8,&this->source);
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::end
            (&local_a0,&this->source);
  local_e0 = this;
  while( true ) {
    IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::iterator::
    iterator(&local_68,&local_a0);
    bVar2 = IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
            iterator::operator!=(&local_d8,&local_68);
    AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_68.source);
    __x._M_current = local_d8.source.current._M_current;
    if (!bVar2) break;
    local_e1 = std::function<bool_(const_int_&)>::operator()
                         (&this->transformer,local_d8.source.current._M_current);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_e1);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,__x._M_current);
    local_d8.source.current._M_current = local_d8.source.current._M_current + 1;
    local_d8.valid = local_d8.source.current._M_current != local_d8.source.end._M_current;
  }
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_a0.source);
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::~AdapterState(&local_d8.source);
  (local_e0->current)._M_node =
       (local_e0->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}